

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# severity.c
# Opt level: O0

stumpless_severity stumpless_get_severity_enum(char *severity_string)

{
  stumpless_severity severity;
  int iVar1;
  size_t severity_buffer_length;
  stumpless_severity severity_val;
  char *severity_string_local;
  
  severity_buffer_length = strlen(severity_string);
  severity = stumpless_get_severity_enum_from_buffer(severity_string,severity_buffer_length);
  iVar1 = severity_is_invalid(severity);
  if (iVar1 == 0) {
    clear_error();
  }
  else {
    raise_invalid_severity(severity);
  }
  return severity;
}

Assistant:

enum stumpless_severity stumpless_get_severity_enum(const char *severity_string) {
  enum stumpless_severity severity_val = stumpless_get_severity_enum_from_buffer(severity_string, strlen(severity_string));
  if ( severity_is_invalid( severity_val ) ) {
    raise_invalid_severity( severity_val );
  } else {
    clear_error(  );
  }
  return severity_val;
}